

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void __thiscall FSlide::SlideMove(FSlide *this,AActor *mo,DVector2 *tryp,int numsteps)

{
  double dVar1;
  player_t *ppVar2;
  double dVar3;
  DVector2 *pDVar4;
  bool bVar5;
  secplane_t *psVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  DVector2 move;
  double local_b8;
  DVector2 local_a8;
  double local_98;
  undefined8 uStack_90;
  DVector2 *local_80;
  DVector2 lead;
  
  this->slidemo = mo;
  if (((mo->player == (player_t *)0x0) || (mo->player->mo != (APlayerPawn *)mo)) ||
     (mo->reactiontime < 1)) {
    local_80 = &this->tmmove;
    iVar7 = -3;
    while (iVar7 = iVar7 + 1, iVar7 != 0) {
      dVar8 = mo->radius;
      dVar10 = tryp->X;
      dVar3 = tryp->Y;
      dVar9 = -dVar8;
      if (dVar10 <= 0.0) {
        dVar9 = dVar8;
      }
      dVar11 = (mo->__Pos).X;
      local_98 = (double)(~-(ulong)(0.0 < dVar10) & (ulong)-dVar8 |
                         -(ulong)(0.0 < dVar10) & (ulong)dVar8) + dVar11;
      dVar1 = (mo->__Pos).Y;
      if (dVar3 <= 0.0) {
        local_b8 = dVar1 + dVar8;
        dVar12 = dVar1 - dVar8;
      }
      else {
        dVar12 = dVar1 + dVar8;
        local_b8 = dVar1 - dVar8;
      }
      dVar11 = dVar11 + dVar9;
      this->bestSlidefrac = 1.01;
      move.X = dVar10 + local_98;
      move.Y = dVar3 + dVar12;
      uStack_90 = 0x8000000000000000;
      lead.X = local_98;
      lead.Y = dVar12;
      SlideTraverse(this,&lead,&move);
      local_a8.X = dVar11 + tryp->X;
      local_a8.Y = dVar12 + tryp->Y;
      move.X = dVar11;
      move.Y = dVar12;
      SlideTraverse(this,&move,&local_a8);
      move.X = local_98;
      move.Y = local_b8;
      local_a8.X = local_98 + tryp->X;
      local_a8.Y = local_b8 + tryp->Y;
      SlideTraverse(this,&move,&local_a8);
      if (1.0 < this->bestSlidefrac) break;
      dVar8 = this->bestSlidefrac + -0.03125;
      this->bestSlidefrac = dVar8;
      if (0.0 < dVar8) {
        dVar10 = (mo->Vel).X;
        local_98 = (mo->Vel).Y;
        move.X = (mo->__Pos).X + dVar8 * tryp->X;
        move.Y = (mo->__Pos).Y + dVar8 * tryp->Y;
        bVar5 = P_TryMove(mo,&move,1,(secplane_t *)0x0);
        if (!bVar5) break;
        dVar8 = (mo->Vel).X;
        if (dVar8 != dVar10) {
          return;
        }
        if (NAN(dVar8) || NAN(dVar10)) {
          return;
        }
        dVar8 = (mo->Vel).Y;
        if (dVar8 != local_98) {
          return;
        }
        if (NAN(dVar8) || NAN(local_98)) {
          return;
        }
        dVar8 = this->bestSlidefrac;
      }
      dVar8 = 1.0 - (dVar8 + 0.03125);
      this->bestSlidefrac = dVar8;
      if (dVar8 <= 1.0) {
        if (dVar8 <= 0.0) {
          return;
        }
      }
      else {
        this->bestSlidefrac = 1.0;
        dVar8 = 1.0;
      }
      dVar10 = dVar8 * tryp->X;
      dVar8 = dVar8 * tryp->Y;
      (this->tmmove).X = dVar10;
      (this->tmmove).Y = dVar8;
      tryp->X = dVar10;
      tryp->Y = dVar8;
      HitSlideLine(this,this->bestslideline);
      pDVar4 = local_80;
      dVar8 = (this->tmmove).X * (double)numsteps;
      dVar10 = (this->tmmove).Y * (double)numsteps;
      (mo->Vel).X = dVar8;
      (mo->Vel).Y = dVar10;
      ppVar2 = mo->player;
      if ((ppVar2 != (player_t *)0x0) && (ppVar2->mo == (APlayerPawn *)mo)) {
        if (ABS(dVar8) < ABS((ppVar2->Vel).X)) {
          (ppVar2->Vel).X = dVar8;
        }
        if (ABS(dVar10) < ABS((ppVar2->Vel).Y)) {
          (ppVar2->Vel).Y = dVar10;
        }
      }
      psVar6 = P_CheckSlopeWalk(mo,local_80);
      move.X = pDVar4->X + (mo->__Pos).X;
      move.Y = pDVar4->Y + (mo->__Pos).Y;
      bVar5 = P_TryMove(mo,&move,1,psVar6);
      if (bVar5) {
        return;
      }
    }
    move.Y = tryp->Y;
    move.X = 0.0;
    psVar6 = P_CheckSlopeWalk(mo,&move);
    local_a8.X = (mo->__Pos).X + move.X;
    local_a8.Y = (mo->__Pos).Y + move.Y;
    bVar5 = P_TryMove(mo,&local_a8,1,psVar6);
    if (!bVar5) {
      move.X = tryp->X;
      move.Y = 0.0;
      psVar6 = P_CheckSlopeWalk(mo,&move);
      local_a8.X = (mo->__Pos).X + move.X;
      local_a8.Y = (mo->__Pos).Y + move.Y;
      P_TryMove(mo,&local_a8,1,psVar6);
    }
  }
  return;
}

Assistant:

void FSlide::SlideMove(AActor *mo, DVector2 tryp, int numsteps)
{
	DVector2 lead;
	DVector2 trail;
	DVector2 newpos;
	DVector2 move;
	const secplane_t * walkplane;
	int hitcount;

	hitcount = 3;
	slidemo = mo;

	if (mo->player && mo->player->mo == mo && mo->reactiontime > 0)
		return;	// player coming right out of a teleporter.

retry:
	if (!--hitcount)
		goto stairstep; 		// don't loop forever

	// trace along the three leading corners
	if (tryp.X > 0)
	{
		lead.X = mo->X() + mo->radius;
		trail.X = mo->X() - mo->radius;
	}
	else
	{
		lead.X = mo->X() - mo->radius;
		trail.X = mo->X() + mo->radius;
	}

	if (tryp.Y > 0)
	{
		lead.Y = mo->Y() + mo->radius;
		trail.Y = mo->Y() - mo->radius;
	}
	else
	{
		lead.Y = mo->Y() - mo->radius;
		trail.Y = mo->Y() + mo->radius;
	}

	bestSlidefrac = 1.01;

	SlideTraverse(lead, lead + tryp);
	SlideTraverse(DVector2(trail.X, lead.Y), tryp + DVector2(trail.X, lead.Y));
	SlideTraverse(DVector2(lead.X, trail.Y), tryp + DVector2(lead.X, trail.Y));

	// move up to the wall
	if (bestSlidefrac > 1)
	{
		// the move must have hit the middle, so stairstep
	stairstep:
		// killough 3/15/98: Allow objects to drop off ledges
		move = { 0, tryp.Y };
		walkplane = P_CheckSlopeWalk(mo, move);
		if (!P_TryMove(mo, mo->Pos() + move, true, walkplane))
		{
			move = { tryp.X, 0 };
			walkplane = P_CheckSlopeWalk(mo, move);
			P_TryMove(mo, mo->Pos() + move, true, walkplane);
		}
		return;
	}

	// fudge a bit to make sure it doesn't hit
	bestSlidefrac -= 1. / 32;
	if (bestSlidefrac > 0)
	{
		newpos = tryp * bestSlidefrac;

		// [BL] We need to abandon this function if we end up going through a teleporter
		const DVector2 startvel = mo->Vel.XY();

		// killough 3/15/98: Allow objects to drop off ledges
		if (!P_TryMove(mo, mo->Pos() + newpos, true))
			goto stairstep;

		if (mo->Vel.XY() != startvel)
			return;
	}

	// Now continue along the wall.
	bestSlidefrac = 1. - (bestSlidefrac + 1. / 32);	// remainder
	if (bestSlidefrac > 1)
		bestSlidefrac = 1;
	else if (bestSlidefrac <= 0)
		return;

	tryp = tmmove = tryp*bestSlidefrac;

	HitSlideLine(bestslideline); 	// clip the moves

	mo->Vel.X = tmmove.X * numsteps;
	mo->Vel.Y = tmmove.Y * numsteps;

	// killough 10/98: affect the bobbing the same way (but not voodoo dolls)
	if (mo->player && mo->player->mo == mo)
	{
		if (fabs(mo->player->Vel.X) > fabs(mo->Vel.X))
			mo->player->Vel.X = mo->Vel.X;
		if (fabs(mo->player->Vel.Y) > fabs(mo->Vel.Y))
			mo->player->Vel.Y = mo->Vel.Y;
	}

	walkplane = P_CheckSlopeWalk(mo, tmmove);

	// killough 3/15/98: Allow objects to drop off ledges
	if (!P_TryMove(mo, mo->Pos() + tmmove, true, walkplane))
	{
		goto retry;
	}
}